

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O3

void Vaxpy_Serial(realtype a,N_Vector x,N_Vector y)

{
  ulong uVar1;
  long in_RDX;
  realtype *yd;
  int iVar2;
  
  iVar2 = (int)x;
  if ((a != 1.0) || (NAN(a))) {
    if ((a != -1.0) || (NAN(a))) {
      if (0 < iVar2) {
        uVar1 = 0;
        do {
          *(double *)(in_RDX + uVar1 * 8) =
               (double)(&y->content)[uVar1] * a + *(double *)(in_RDX + uVar1 * 8);
          uVar1 = uVar1 + 1;
        } while (((ulong)x & 0xffffffff) != uVar1);
      }
    }
    else if (0 < iVar2) {
      uVar1 = 0;
      do {
        *(double *)(in_RDX + uVar1 * 8) =
             *(double *)(in_RDX + uVar1 * 8) - (double)(&y->content)[uVar1];
        uVar1 = uVar1 + 1;
      } while (((ulong)x & 0xffffffff) != uVar1);
    }
  }
  else if (0 < iVar2) {
    uVar1 = 0;
    do {
      *(double *)(in_RDX + uVar1 * 8) =
           (double)(&y->content)[uVar1] + *(double *)(in_RDX + uVar1 * 8);
      uVar1 = uVar1 + 1;
    } while (((ulong)x & 0xffffffff) != uVar1);
  }
  return;
}

Assistant:

static void Vaxpy_Serial(realtype a, N_Vector x, N_Vector y)
{
  sunindextype i, N;
  realtype *xd, *yd;

  xd = yd = NULL;

  N  = NV_LENGTH_S(x);
  xd = NV_DATA_S(x);
  yd = NV_DATA_S(y);

  if (a == ONE) {
    for (i = 0; i < N; i++)
      yd[i] += xd[i];
    return;
  }

  if (a == -ONE) {
    for (i = 0; i < N; i++)
      yd[i] -= xd[i];
    return;
  }

  for (i = 0; i < N; i++)
    yd[i] += a*xd[i];

  return;
}